

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_getc(BGZF *fp)

{
  byte bVar1;
  hFILE *phVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = fp->block_length;
  iVar3 = fp->block_offset;
  if (iVar4 <= iVar3) {
    iVar4 = bgzf_read_block(fp);
    if (iVar4 != 0) {
      return -2;
    }
    iVar4 = fp->block_length;
    if (iVar4 == 0) {
      return -1;
    }
    iVar3 = fp->block_offset;
  }
  fp->block_offset = iVar3 + 1;
  bVar1 = *(byte *)((long)fp->uncompressed_block + (long)iVar3);
  if (iVar3 + 1 == iVar4) {
    phVar2 = fp->fp;
    fp->block_address = (int64_t)(phVar2->begin + (phVar2->offset - (long)phVar2->buffer));
    fp->block_length = 0;
    fp->block_offset = 0;
  }
  fp->uncompressed_address = fp->uncompressed_address + 1;
  return (uint)bVar1;
}

Assistant:

int bgzf_getc(BGZF *fp)
{
    int c;
    if (fp->block_offset >= fp->block_length) {
        if (bgzf_read_block(fp) != 0) return -2; /* error */
        if (fp->block_length == 0) return -1; /* end-of-file */
    }
    c = ((unsigned char*)fp->uncompressed_block)[fp->block_offset++];
    if (fp->block_offset == fp->block_length) {
        fp->block_address = htell(fp->fp);
        fp->block_offset = 0;
        fp->block_length = 0;
    }
    fp->uncompressed_address++;
    return c;
}